

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zhuffman_decode_slowpath(stbi__zbuf *a,stbi__zhuffman *z)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  int k;
  int s;
  int b;
  undefined4 local_20;
  undefined4 local_4;
  
  iVar3 = stbi__bit_reverse(0,0x121ab0);
  local_20 = 10;
  while (*(int *)(in_RSI + 0x420 + (long)local_20 * 4) <= iVar3) {
    local_20 = local_20 + 1;
  }
  if (local_20 == 0x10) {
    local_4 = 0xffffffff;
  }
  else {
    uVar1 = *(ushort *)(in_RSI + 0x400 + (long)local_20 * 2);
    uVar2 = *(ushort *)(in_RSI + 0x464 + (long)local_20 * 2);
    *(uint *)(in_RDI + 0x14) = *(uint *)(in_RDI + 0x14) >> ((byte)local_20 & 0x1f);
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) - local_20;
    local_4 = (uint)*(ushort *)
                     (in_RSI + 0x5a4 +
                     (long)(int)(((iVar3 >> (0x10 - (byte)local_20 & 0x1f)) - (uint)uVar1) +
                                (uint)uVar2) * 2);
  }
  return local_4;
}

Assistant:

static int stbi__zhuffman_decode_slowpath(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s,k;
   // not resolved by fast table, so compute it the slow way
   // use jpeg approach, which requires MSbits at top
   k = stbi__bit_reverse(a->code_buffer, 16);
   for (s=STBI__ZFAST_BITS+1; ; ++s)
      if (k < z->maxcode[s])
         break;
   if (s == 16) return -1; // invalid code!
   // code size is s, so:
   b = (k >> (16-s)) - z->firstcode[s] + z->firstsymbol[s];
   STBI_ASSERT(z->size[b] == s);
   a->code_buffer >>= s;
   a->num_bits -= s;
   return z->value[b];
}